

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O1

void Sat_SolverPrintStats(FILE *pFile,sat_solver *p)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (p->stats).starts;
  printf("starts        : %16.0f\n",
         (double)(uVar1 >> 0x1e) * 1073741824.0 + (double)(uVar1 & 0x3fffffff));
  uVar2 = (p->stats).conflicts;
  printf("conflicts     : %16.0f\n",
         (double)(uVar2 >> 0x1e & 0xffffffff) * 1073741824.0 + (double)((uint)uVar2 & 0x3fffffff));
  uVar2 = (p->stats).decisions;
  printf("decisions     : %16.0f\n",
         (double)(uVar2 >> 0x1e & 0xffffffff) * 1073741824.0 + (double)((uint)uVar2 & 0x3fffffff));
  uVar2 = (p->stats).propagations;
  printf("propagations  : %16.0f\n",
         (double)(uVar2 >> 0x1e & 0xffffffff) * 1073741824.0 + (double)((uint)uVar2 & 0x3fffffff));
  return;
}

Assistant:

void Sat_SolverPrintStats( FILE * pFile, sat_solver * p )
{
//    printf( "calls         : %10d (%d)\n", (int)p->nCalls, (int)p->nCalls2 );
    printf( "starts        : %16.0f\n", Sat_Wrd2Dbl(p->stats.starts) );
    printf( "conflicts     : %16.0f\n", Sat_Wrd2Dbl(p->stats.conflicts) );
    printf( "decisions     : %16.0f\n", Sat_Wrd2Dbl(p->stats.decisions) );
    printf( "propagations  : %16.0f\n", Sat_Wrd2Dbl(p->stats.propagations) );
//    printf( "inspects      : %10d\n", (int)p->stats.inspects );
//    printf( "inspects2     : %10d\n", (int)p->stats.inspects2 );
}